

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O1

Promise<void> __thiscall
capnp::_::TestMoreStuffImpl::neverReturn(TestMoreStuffImpl *this,NeverReturnContext context)

{
  Disposer *pDVar1;
  ClientHook *pCVar2;
  WirePointer *pWVar3;
  int iVar4;
  long *in_RDX;
  PromiseNode *extraout_RDX;
  Promise<void> PVar5;
  Promise<void> promise;
  undefined1 local_e0 [8];
  Own<capnp::ClientHook> OStack_d8;
  PointerReader local_c8;
  Promise<void> local_a8;
  undefined1 local_98 [32];
  StructReader local_78;
  StructBuilder local_48;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  kj::_::neverDone();
  local_e0 = (undefined1  [8])local_78.segment;
  OStack_d8.disposer = (Disposer *)local_78.capTable;
  (**(code **)*in_RDX)(local_98);
  local_48.data = (void *)local_98._16_8_;
  local_48.pointers = (WirePointer *)local_98._24_8_;
  local_48.segment = (SegmentBuilder *)local_98._0_8_;
  local_48.capTable = (CapTableBuilder *)local_98._8_8_;
  PointerReader::getStruct(&local_78,(PointerReader *)&local_48,(word *)0x0);
  local_48.data = local_78.pointers;
  iVar4 = local_78.nestingLimit;
  if (local_78.pointerCount == 0) {
    local_78.capTable = (CapTableReader *)0x0;
    local_78.segment = (SegmentReader *)0x0;
    local_48.data = (WirePointer *)0x0;
    iVar4 = 0x7fffffff;
  }
  local_48.pointers = (WirePointer *)CONCAT44(local_48.pointers._4_4_,iVar4);
  local_48.segment = (SegmentBuilder *)local_78.segment;
  local_48.capTable = (CapTableBuilder *)local_78.capTable;
  PointerReader::getCapability((PointerReader *)local_98);
  local_c8.capTable = (CapTableReader *)local_98._0_8_;
  local_c8.pointer = (WirePointer *)local_98._8_8_;
  local_c8.segment = (SegmentReader *)&Capability::Client::typeinfo;
  PVar5 = kj::Promise<void>::attach<capnproto_test::capnp::test::TestInterface::Client>
                    (&local_a8,(Client *)local_e0);
  pWVar3 = local_c8.pointer;
  if (local_c8.pointer != (WirePointer *)0x0) {
    local_c8.pointer = (WirePointer *)0x0;
    (*(code *)((SegmentReader *)&(local_c8.capTable)->_vptr_CapTableReader)->arena->_vptr_Arena)
              (local_c8.capTable,
               (long)&(pWVar3->offsetAndKind).value + *(long *)((long)*pWVar3 + -0x10),
               PVar5.super_PromiseBase.node.ptr);
  }
  pDVar1 = OStack_d8.disposer;
  if ((CapTableReader *)OStack_d8.disposer != (CapTableReader *)0x0) {
    OStack_d8.disposer = (Disposer *)0x0;
    (*(code *)((SegmentReader *)local_e0)->arena->_vptr_Arena)
              (local_e0,((CapTableReader *)&pDVar1->_vptr_Disposer)->_vptr_CapTableReader[-2] +
                        (long)&pDVar1->_vptr_Disposer);
  }
  local_c8.segment = (SegmentReader *)((ulong)local_c8.segment & 0xffffffffffffff00);
  (**(code **)(*in_RDX + 0x10))(local_98);
  local_78.data = (void *)local_98._16_8_;
  local_78.segment = (SegmentReader *)local_98._0_8_;
  local_78.capTable = (CapTableReader *)local_98._8_8_;
  PointerBuilder::getStruct(&local_48,(PointerBuilder *)&local_78,(StructSize)0x10000,(word *)0x0);
  (**(code **)*in_RDX)(&local_c8);
  local_98._16_8_ = local_c8.pointer;
  local_98._24_8_ = local_c8._24_8_;
  local_98._0_8_ = local_c8.segment;
  local_98._8_8_ = local_c8.capTable;
  PointerReader::getStruct(&local_78,(PointerReader *)local_98,(word *)0x0);
  local_98._8_8_ = local_78.capTable;
  local_98._0_8_ = local_78.segment;
  if (local_78.pointerCount == 0) {
    local_78.nestingLimit = 0x7fffffff;
    local_78.pointers = (WirePointer *)0x0;
    local_98._8_8_ = (WirePointer *)0x0;
    local_98._0_8_ = (SegmentBuilder *)0x0;
  }
  local_98._24_4_ = local_78.nestingLimit;
  local_98._16_8_ = local_78.pointers;
  PointerReader::getCapability(&local_c8);
  OStack_d8.disposer = (Disposer *)local_c8.segment;
  OStack_d8.ptr = (ClientHook *)local_c8.capTable;
  local_e0 = (undefined1  [8])&Capability::Client::typeinfo;
  local_98._0_8_ = local_48.segment;
  local_98._8_8_ = local_48.capTable;
  local_98._16_8_ = local_48.pointers;
  PointerBuilder::setCapability((PointerBuilder *)local_98,&OStack_d8);
  pCVar2 = OStack_d8.ptr;
  if ((SegmentBuilder *)OStack_d8.ptr != (SegmentBuilder *)0x0) {
    OStack_d8.ptr = (ClientHook *)0x0;
    (*(code *)((SegmentReader *)&(OStack_d8.disposer)->_vptr_Disposer)->arena->_vptr_Arena)
              (OStack_d8.disposer,
               (long)&((SegmentReader *)&pCVar2->_vptr_ClientHook)->arena +
               (long)((SegmentReader *)&pCVar2->_vptr_ClientHook)->arena[-2]._vptr_Arena);
  }
  (**(code **)(*in_RDX + 0x20))();
  *(Disposer **)&this->super_Server = local_a8.super_PromiseBase.node.disposer;
  *(PromiseNode **)&(this->super_Server).field_0x8 = local_a8.super_PromiseBase.node.ptr;
  PVar5.super_PromiseBase.node.ptr = extraout_RDX;
  PVar5.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar5.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> TestMoreStuffImpl::neverReturn(NeverReturnContext context) {
  ++callCount;

  // Attach `cap` to the promise to make sure it is released.
  auto promise = kj::Promise<void>(kj::NEVER_DONE).attach(context.getParams().getCap());

  // Also attach `cap` to the result struct to make sure that is released.
  context.getResults().setCapCopy(context.getParams().getCap());

  context.allowCancellation();
  return kj::mv(promise);
}